

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_array_container_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  uint64_t *puVar2;
  uint16_t *puVar3;
  long lVar4;
  int32_t min;
  array_container_t *out;
  bitset_container_t *bitset;
  uint64_t uVar5;
  size_t sVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint16_t *puVar11;
  bitset_container_t *ourbitset;
  
  iVar8 = src_1->cardinality;
  iVar1 = src_2->cardinality;
  iVar9 = iVar1 + iVar8;
  *dst = (container_t *)0x0;
  if (iVar9 < 0x1001) {
    if (src_1->capacity < iVar9) {
      out = array_container_create_given_capacity(iVar9 * 2);
      *dst = out;
      if (out == (array_container_t *)0x0) {
        return true;
      }
      array_container_union(src_1,src_2,out);
    }
    else {
      memmove(src_1->array + iVar1,src_1->array,(long)iVar8 * 2);
      sVar6 = union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,src_2->array,
                           (long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar6;
    }
  }
  else {
    bitset = bitset_container_create();
    *dst = bitset;
    if (bitset == (bitset_container_t *)0x0) {
      return true;
    }
    bitset_set_list(bitset->words,src_1->array,(long)src_1->cardinality);
    uVar5 = bitset_set_list_withcard
                      (bitset->words,(long)src_1->cardinality,src_2->array,(long)src_2->cardinality)
    ;
    min = (int32_t)uVar5;
    bitset->cardinality = min;
    if (0x1000 < min) {
      return true;
    }
    if (src_1->capacity < min) {
      array_container_grow(src_1,min,false);
    }
    puVar2 = bitset->words;
    puVar3 = src_1->array;
    uVar7 = 0;
    iVar8 = 0;
    lVar10 = 0;
    do {
      uVar5 = puVar2[lVar10];
      if (uVar5 != 0) {
        puVar11 = puVar3 + iVar8;
        do {
          lVar4 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          *puVar11 = (ushort)lVar4 | uVar7;
          puVar11 = puVar11 + 1;
          iVar8 = iVar8 + 1;
          uVar5 = uVar5 & uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar7 = uVar7 + 0x40;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x400);
    src_1->cardinality = bitset->cardinality;
    *dst = src_1;
    bitset_container_free(bitset);
  }
  return false;
}

Assistant:

bool array_array_container_inplace_union(
    array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        if(src_1->capacity < totalCardinality) {
          *dst = array_container_create_given_capacity(2  * totalCardinality); // be purposefully generous
          if (*dst != NULL) {
              array_container_union(src_1, src_2, CAST_array(*dst));
          } else {
              return true; // otherwise failure won't be caught
          }
          return false;  // not a bitset
        } else {
          memmove(src_1->array + src_2->cardinality, src_1->array, src_1->cardinality * sizeof(uint16_t));
          src_1->cardinality = (int32_t)union_uint16(src_1->array + src_2->cardinality, src_1->cardinality,
                                  src_2->array, src_2->cardinality, src_1->array);
          return false; // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            if(src_1->capacity < ourbitset->cardinality) {
              array_container_grow(src_1, ourbitset->cardinality, false);
            }

            bitset_extract_setbits_uint16(ourbitset->words, BITSET_CONTAINER_SIZE_IN_WORDS,
                                  src_1->array, 0);
            src_1->cardinality =  ourbitset->cardinality;
            *dst = src_1;
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}